

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::OP_GetThisNoFastPath
              (Var thisVar,int moduleID,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  Var pvVar5;
  HostObjectBase *pHVar6;
  RootObjectBase *rootObject;
  Type typeId;
  
  if (thisVar == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00ac0483;
    *puVar4 = 0;
  }
  if (((ulong)thisVar & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)thisVar & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ac0483;
    *puVar4 = 0;
  }
  typeId = TypeIds_FirstNumberType;
  if ((((ulong)thisVar & 0xffff000000000000) != 0x1000000000000) &&
     (typeId = TypeIds_Number, (ulong)thisVar >> 0x32 == 0)) {
    this = UnsafeVarTo<Js::RecyclableObject>(thisVar);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00ac0483;
      *puVar4 = 0;
    }
    typeId = ((this->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00ac0483;
      *puVar4 = 0;
    }
  }
  if (0x3a < typeId - TypeIds_HostDispatch) {
    pvVar5 = GetThisHelper(thisVar,typeId,moduleID,&scriptContext->super_ScriptContextInfo);
    return pvVar5;
  }
  if (typeId == TypeIds_LastTrueJavascriptObjectType) {
    pHVar6 = RootObjectBase::GetHostObject((RootObjectBase *)thisVar);
    pvVar5 = thisVar;
    if (pHVar6 != (HostObjectBase *)0x0) {
      pvVar5 = (Var)(**(code **)(*(long *)pHVar6 + 0x2b8))(pHVar6);
    }
    if (pvVar5 != thisVar) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x156c,
                                  "(typeId != TypeIds_ModuleRoot || JavascriptOperators::GetThisFromModuleRoot(thisVar) == thisVar)"
                                  ,
                                  "typeId != TypeIds_ModuleRoot || JavascriptOperators::GetThisFromModuleRoot(thisVar) == thisVar"
                                 );
      if (!bVar2) {
LAB_00ac0483:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  else if ((typeId == TypeIds_GlobalObject) &&
          (pvVar5 = GlobalObject::ToThis((GlobalObject *)thisVar), pvVar5 != thisVar)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x156b,
                                "(typeId != TypeIds_GlobalObject || ((Js::GlobalObject*)thisVar)->ToThis() == thisVar)"
                                ,
                                "typeId != TypeIds_GlobalObject || ((Js::GlobalObject*)thisVar)->ToThis() == thisVar"
                               );
    if (!bVar2) goto LAB_00ac0483;
    *puVar4 = 0;
  }
  return thisVar;
}

Assistant:

Var JavascriptOperators::OP_GetThisNoFastPath(Var thisVar, int moduleID, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(LdThisNoFastPath);
        TypeId typeId = JavascriptOperators::GetTypeId(thisVar);

        if (JavascriptOperators::IsThisSelf(typeId))
        {
            Assert(typeId != TypeIds_GlobalObject || ((Js::GlobalObject*)thisVar)->ToThis() == thisVar);
            Assert(typeId != TypeIds_ModuleRoot || JavascriptOperators::GetThisFromModuleRoot(thisVar) == thisVar);

            return thisVar;
        }

        return JavascriptOperators::GetThisHelper(thisVar, typeId, moduleID, scriptContext);
        JIT_HELPER_END(LdThisNoFastPath);
    }